

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

string * vkt::anon_unknown_0::specializeFragmentShader
                   (string *__return_storage_ptr__,ShaderCaseSpecification *spec,string *src)

{
  DataType DVar1;
  DataType dataType;
  int iVar2;
  Value *pVVar3;
  const_reference pvVar4;
  char *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  const_reference pvVar8;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var9;
  undefined1 local_708 [8];
  string baseSrc;
  StringTemplate tmpl;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6b8;
  _Base_ptr local_678;
  undefined1 local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_648;
  _Base_ptr local_608;
  undefined1 local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d8;
  _Base_ptr local_598;
  undefined1 local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_568;
  undefined1 local_528 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  char *refTypeStr;
  DataType basicType;
  Value *val_1;
  size_t ndx_1;
  int numLocs;
  char *transportTypeStr;
  DataType transportType;
  char *valueTypeStr;
  DataType valueType;
  Value *val;
  size_t ndx;
  ostringstream local_498 [4];
  int curInputLoc;
  ostringstream output;
  ostringstream local_310 [8];
  ostringstream setup;
  ostringstream local_198 [8];
  ostringstream decl;
  string *src_local;
  ShaderCaseSpecification *spec_local;
  string *withExt;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_310);
  std::__cxx11::ostringstream::ostringstream(local_498);
  ndx._4_4_ = 0;
  glu::sl::genCompareFunctions((ostringstream *)local_198,&spec->values,false);
  genCompareOp((ostringstream *)local_498,"dEQP_FragColor",&spec->values,(char *)0x0);
  std::operator<<((ostream *)local_198,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
  for (val = (Value *)0x0;
      pVVar3 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                  (&(spec->values).inputs), val < pVVar3;
      val = (Value *)((long)&(val->type).m_type + 1)) {
    pvVar4 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                       (&(spec->values).inputs,(size_type)val);
    DVar1 = glu::VarType::getBasicType(&pvVar4->type);
    pcVar5 = glu::getDataTypeName(DVar1);
    dataType = getTransportType(DVar1);
    pcVar6 = glu::getDataTypeName(dataType);
    iVar2 = getNumTransportLocations(DVar1);
    poVar7 = std::operator<<((ostream *)local_198,"layout(location = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,ndx._4_4_);
    std::operator<<(poVar7,") flat in ");
    ndx._4_4_ = iVar2 + ndx._4_4_;
    if (DVar1 == dataType) {
      poVar7 = std::operator<<((ostream *)local_198,pcVar6);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = std::operator<<(poVar7,(string *)&pvVar4->name);
      std::operator<<(poVar7,";\n");
    }
    else {
      poVar7 = std::operator<<((ostream *)local_198,pcVar6);
      poVar7 = std::operator<<(poVar7," v_");
      poVar7 = std::operator<<(poVar7,(string *)&pvVar4->name);
      std::operator<<(poVar7,";\n");
      poVar7 = std::operator<<((ostream *)local_310,pcVar5);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = std::operator<<(poVar7,(string *)&pvVar4->name);
      poVar7 = std::operator<<(poVar7," = ");
      poVar7 = std::operator<<(poVar7,pcVar5);
      poVar7 = std::operator<<(poVar7,"(v_");
      poVar7 = std::operator<<(poVar7,(string *)&pvVar4->name);
      std::operator<<(poVar7,");\n");
    }
  }
  declareUniforms((ostringstream *)local_198,&spec->values);
  declareReferenceBlock((ostringstream *)local_198,&spec->values);
  for (val_1 = (Value *)0x0;
      pVVar3 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                  (&(spec->values).outputs), val_1 < pVVar3;
      val_1 = (Value *)((long)&(val_1->type).m_type + 1)) {
    pvVar4 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                       (&(spec->values).outputs,(size_type)val_1);
    DVar1 = glu::VarType::getBasicType(&pvVar4->type);
    params._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)glu::getDataTypeName(DVar1);
    poVar7 = std::operator<<((ostream *)local_198,
                             (char *)params._M_t._M_impl.super__Rb_tree_header._M_node_count);
    poVar7 = std::operator<<(poVar7," ");
    poVar7 = std::operator<<(poVar7,(string *)&pvVar4->name);
    std::operator<<(poVar7,";\n");
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_528);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_568,(char (*) [13])0x12bde3a,&local_588);
  _Var9 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_528,&local_568);
  local_598 = (_Base_ptr)_Var9.first._M_node;
  local_590 = _Var9.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_568);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_5d8,(char (*) [6])0x12bdc83,&local_5f8);
  _Var9 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_528,&local_5d8);
  local_608 = (_Base_ptr)_Var9.first._M_node;
  local_600 = _Var9.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_5d8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_648,(char (*) [7])0x137ac60,&local_668);
  _Var9 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_528,&local_648);
  local_678 = (_Base_ptr)_Var9.first._M_node;
  local_670 = _Var9.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_648);
  std::__cxx11::string::~string((string *)&local_668);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[15],_true>
            (&local_6b8,(char (*) [20])"POSITION_FRAG_COLOR",(char (*) [15])"dEQP_FragColor");
  std::
  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)local_528,&local_6b8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_6b8);
  tcu::StringTemplate::StringTemplate((StringTemplate *)((long)&baseSrc.field_2 + 8),src);
  tcu::StringTemplate::specialize
            ((string *)local_708,(StringTemplate *)((long)&baseSrc.field_2 + 8),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_528);
  pvVar8 = std::
           vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
           operator[](&spec->programs,0);
  glu::sl::injectExtensionRequirements
            (__return_storage_ptr__,(string *)local_708,&pvVar8->requiredExtensions,
             SHADERTYPE_FRAGMENT);
  std::__cxx11::string::~string((string *)local_708);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)((long)&baseSrc.field_2 + 8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_528);
  std::__cxx11::ostringstream::~ostringstream(local_498);
  std::__cxx11::ostringstream::~ostringstream(local_310);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string specializeFragmentShader (const ShaderCaseSpecification& spec, const string& src)
{
	ostringstream		decl;
	ostringstream		setup;
	ostringstream		output;
	int					curInputLoc	= 0;

	// generated from "both" case
	DE_ASSERT(spec.caseType == glu::sl::CASETYPE_FRAGMENT_ONLY);

	genCompareFunctions(decl, spec.values, false);
	genCompareOp(output, "dEQP_FragColor", spec.values, DE_NULL);

	decl << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";

	for (size_t ndx = 0; ndx < spec.values.inputs.size(); ndx++)
	{
		const Value&		val					= spec.values.inputs[ndx];
		const DataType		valueType			= val.type.getBasicType();
		const char*	const	valueTypeStr		= getDataTypeName(valueType);
		const DataType		transportType		= getTransportType(valueType);
		const char* const	transportTypeStr	= getDataTypeName(transportType);
		const int			numLocs				= getNumTransportLocations(valueType);

		decl << "layout(location = " << curInputLoc << ") flat in ";

		curInputLoc += numLocs;

		if (valueType == transportType)
			decl << transportTypeStr << " " << val.name << ";\n";
		else
		{
			decl << transportTypeStr << " v_" << val.name << ";\n";
			setup << valueTypeStr << " " << val.name << " = " << valueTypeStr << "(v_" << val.name << ");\n";
		}
	}

	declareUniforms(decl, spec.values);
	declareReferenceBlock(decl, spec.values);

	for (size_t ndx = 0; ndx < spec.values.outputs.size(); ndx++)
	{
		const Value&		val				= spec.values.outputs[ndx];
		const DataType		basicType		= val.type.getBasicType();
		const char* const	refTypeStr		= getDataTypeName(basicType);

		decl << refTypeStr << " " << val.name << ";\n";
	}

	// Shader specialization.
	map<string, string> params;
	params.insert(pair<string, string>("DECLARATIONS", decl.str()));
	params.insert(pair<string, string>("SETUP", setup.str()));
	params.insert(pair<string, string>("OUTPUT", output.str()));
	params.insert(pair<string, string>("POSITION_FRAG_COLOR", "dEQP_FragColor"));

	StringTemplate	tmpl	(src);
	const string	baseSrc	= tmpl.specialize(params);
	const string	withExt	= injectExtensionRequirements(baseSrc, spec.programs[0].requiredExtensions, glu::SHADERTYPE_FRAGMENT);

	return withExt;
}